

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O3

void Gia_ManAutomWalk(Gia_Man_t *p,int nSteps,int nWalks,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *vTemp;
  word *__s;
  Vec_Wrd_t *p_00;
  word *pwVar3;
  Vec_Int_t *p_01;
  int *piVar4;
  word Init;
  char *__s_00;
  ulong uVar5;
  ulong local_38;
  
  iVar1 = p->nRegs;
  if (p->vCos->nSize - iVar1 == 1) {
    if (p->vCis->nSize - iVar1 < 0x41) {
      if (iVar1 < 0x41) {
        iVar1 = p->nObjs;
        vTemp = (Vec_Wrd_t *)malloc(0x10);
        iVar2 = 0x10;
        if (0xe < iVar1 - 1U) {
          iVar2 = iVar1;
        }
        vTemp->nCap = iVar2;
        if (iVar2 == 0) {
          __s = (word *)0x0;
        }
        else {
          __s = (word *)malloc((long)iVar2 << 3);
        }
        vTemp->pArray = __s;
        vTemp->nSize = iVar1;
        memset(__s,0,(long)iVar1 << 3);
        p_00 = (Vec_Wrd_t *)malloc(0x10);
        p_00->nCap = 1000;
        p_00->nSize = 0;
        pwVar3 = (word *)malloc(8000);
        p_00->pArray = pwVar3;
        p_01 = (Vec_Int_t *)malloc(0x10);
        p_01->nCap = 1000;
        p_01->nSize = 0;
        piVar4 = (int *)malloc(4000);
        p_01->pArray = piVar4;
        Vec_WrdPush(p_00,0);
        Vec_IntPush(p_01,1);
        Init = Gia_ManAutomInit(p);
        if (0 < nWalks) {
          do {
            Gia_ManAutomWalkOne(p,nSteps,p_00,p_01,vTemp,Init);
            nWalks = nWalks + -1;
          } while (nWalks != 0);
        }
        if (fVerbose != 0) {
          iVar1 = p_00->nSize;
          if (0 < (long)iVar1) {
            pwVar3 = p_00->pArray;
            uVar5 = 0;
            do {
              local_38 = pwVar3[uVar5] ^ Init;
              printf("%3d : ",uVar5 & 0xffffffff);
              Extra_PrintBinary(_stdout,(uint *)&local_38,0x40);
              if ((long)p_01->nSize <= (long)uVar5) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              printf(" %d  ",(ulong)(uint)p_01->pArray[uVar5]);
              putchar(10);
              uVar5 = uVar5 + 1;
            } while ((long)iVar1 != uVar5);
          }
          putchar(10);
        }
        if (__s != (word *)0x0) {
          free(__s);
        }
        free(vTemp);
        if (p_00->pArray != (word *)0x0) {
          free(p_00->pArray);
        }
        free(p_00);
        if (p_01->pArray != (int *)0x0) {
          free(p_01->pArray);
        }
        free(p_01);
        return;
      }
      __s_00 = "Cannot simulate an automaton with more than 63 states.";
    }
    else {
      __s_00 = "Cannot simulate an automaton with more than 64 inputs.";
    }
  }
  else {
    __s_00 = "AIG should have one primary output.";
  }
  puts(__s_00);
  return;
}

Assistant:

void Gia_ManAutomWalk( Gia_Man_t * p, int nSteps, int nWalks, int fVerbose )
{
    Vec_Wrd_t * vTemp, * vStates;
    Vec_Int_t * vCounts; int i; word Init;
    if ( Gia_ManPoNum(p) != 1 )
    {
        printf( "AIG should have one primary output.\n" );
        return;
    }
    if ( Gia_ManPiNum(p) > 64 )
    {
        printf( "Cannot simulate an automaton with more than 64 inputs.\n" );
        return;
    }
    if ( Gia_ManRegNum(p) > 64 )
    {
        printf( "Cannot simulate an automaton with more than 63 states.\n" );
        return;
    }
    vTemp   = Vec_WrdStart( Gia_ManObjNum(p) );
    vStates = Vec_WrdAlloc( 1000 );
    vCounts = Vec_IntAlloc( 1000 );
    Vec_WrdPush( vStates, 0 );
    Vec_IntPush( vCounts, 1 );
    Init = Gia_ManAutomInit( p );
    for ( i = 0; i < nWalks; i++ )
        Gia_ManAutomWalkOne( p, nSteps, vStates, vCounts, vTemp, Init );
    if ( fVerbose )
    {
        word State;
        Vec_WrdForEachEntry( vStates, State, i )
        {
            State ^= Init;
            printf( "%3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&State, 64 ); 
            printf( " %d  ", Vec_IntEntry(vCounts, i) );
            printf( "\n" );
        }
        printf( "\n" );
    }
    Vec_WrdFree( vTemp );
    Vec_WrdFree( vStates );
    Vec_IntFree( vCounts );
}